

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O2

void Bac_ManReadBacVecInt(Vec_Str_t *vOut,int *pPos,Vec_Int_t *p,int nSize)

{
  memcpy(p->pArray,vOut->pArray + *pPos,(long)nSize);
  *pPos = *pPos + nSize;
  p->nSize = nSize / 4;
  if (nSize / 4 == p->nCap) {
    return;
  }
  __assert_fail("Vec_IntSize(p) == Vec_IntCap(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacBac.c"
                ,100,"void Bac_ManReadBacVecInt(Vec_Str_t *, int *, Vec_Int_t *, int)");
}

Assistant:

void Bac_ManReadBacVecInt( Vec_Str_t * vOut, int * pPos, Vec_Int_t * p, int nSize )
{
    memcpy( Vec_IntArray(p), Vec_StrArray(vOut) + *pPos, nSize );
    *pPos += nSize;
    p->nSize = nSize / 4;
    assert( Vec_IntSize(p) == Vec_IntCap(p) );
}